

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid_column_reader.hpp
# Opt level: O3

hugeint_t duckdb::UUIDValueConversion::PlainRead<false>(ByteBuffer *plain_data,ColumnReader *reader)

{
  data_ptr_t pdVar1;
  idx_t i;
  long lVar2;
  ulong uVar3;
  hugeint_t hVar4;
  
  pdVar1 = plain_data->ptr;
  lVar2 = 0;
  uVar3 = 0;
  do {
    uVar3 = (ulong)pdVar1[lVar2] | uVar3 << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  lVar2 = 0;
  hVar4.lower = 0;
  do {
    hVar4.lower = (ulong)pdVar1[lVar2 + 8] | hVar4.lower << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  hVar4.upper = uVar3 ^ 0x8000000000000000;
  plain_data->len = plain_data->len - 0x10;
  plain_data->ptr = pdVar1 + 0x10;
  return hVar4;
}

Assistant:

static hugeint_t PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		if (CHECKED) {
			plain_data.available(sizeof(hugeint_t));
		}
		auto res = ReadParquetUUID(const_data_ptr_cast(plain_data.ptr));
		plain_data.unsafe_inc(sizeof(hugeint_t));
		return res;
	}